

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNewLineStyle.cxx
# Opt level: O2

bool __thiscall
cmNewLineStyle::ReadFromArguments
          (cmNewLineStyle *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,string *errorString)

{
  pointer pbVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  
  this->NewLineStyle = Invalid;
  uVar5 = 0;
  lVar2 = 0;
  do {
    lVar6 = lVar2;
    uVar4 = uVar5;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar7 = (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
    uVar5 = uVar4;
    if (uVar7 <= uVar4) goto LAB_001aa86f;
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar1->_M_dataplus)._M_p + lVar6),"NEWLINE_STYLE");
    uVar5 = uVar4 + 1;
    lVar2 = lVar6 + 0x20;
  } while (!bVar3);
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (uVar4 + 1 <
      (ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&pbVar1[1]._M_dataplus._M_p + lVar6);
    bVar3 = std::operator==(__lhs,"LF");
    if ((bVar3) || (bVar3 = std::operator==(__lhs,"UNIX"), bVar3)) {
      this->NewLineStyle = LF;
    }
    else {
      bVar3 = std::operator==(__lhs,"CRLF");
      if (((!bVar3) && (bVar3 = std::operator==(__lhs,"WIN32"), !bVar3)) &&
         (bVar3 = std::operator==(__lhs,"DOS"), !bVar3)) goto LAB_001aa820;
      this->NewLineStyle = CRLF;
    }
    uVar5 = 1;
  }
  else {
LAB_001aa820:
    std::__cxx11::string::assign((char *)errorString);
    uVar5 = 0;
  }
LAB_001aa86f:
  return (bool)(uVar7 <= uVar4 | (byte)uVar5 & 1);
}

Assistant:

bool cmNewLineStyle::ReadFromArguments(const std::vector<std::string>& args,
                                       std::string& errorString)
{
  NewLineStyle = Invalid;

  for (size_t i = 0; i < args.size(); i++) {
    if (args[i] == "NEWLINE_STYLE") {
      size_t const styleIndex = i + 1;
      if (args.size() > styleIndex) {
        std::string const& eol = args[styleIndex];
        if (eol == "LF" || eol == "UNIX") {
          NewLineStyle = LF;
          return true;
        }
        if (eol == "CRLF" || eol == "WIN32" || eol == "DOS") {
          NewLineStyle = CRLF;
          return true;
        }
        errorString = "NEWLINE_STYLE sets an unknown style, only LF, "
                      "CRLF, UNIX, DOS, and WIN32 are supported";
        return false;
      }
      errorString = "NEWLINE_STYLE must set a style: "
                    "LF, CRLF, UNIX, DOS, or WIN32";
      return false;
    }
  }
  return true;
}